

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractproxymodel.cpp
# Opt level: O2

QModelIndex * __thiscall
QAbstractProxyModel::sibling
          (QModelIndex *__return_storage_ptr__,QAbstractProxyModel *this,int row,int column,
          QModelIndex *idx)

{
  long in_FS_OFFSET;
  QModelIndex QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QModelIndex::parent(&QStack_48,idx);
  (**(code **)(*(long *)this + 0x60))(__return_storage_ptr__,this,row,column,&QStack_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QModelIndex QAbstractProxyModel::sibling(int row, int column, const QModelIndex &idx) const
{
    return index(row, column, idx.parent());
}